

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

_Bool parse_node_double_tuple_section
                (VrplibParser *p,Instance *instance,char *valuename,double *outarray)

{
  _Bool _Var1;
  bool bVar2;
  double local_48;
  double value;
  char *lexeme;
  uint local_30;
  int32_t i;
  int32_t node_id;
  _Bool result;
  double *outarray_local;
  char *valuename_local;
  Instance *instance_local;
  VrplibParser *p_local;
  
  i._3_1_ = 1;
  local_30 = 0;
  _node_id = outarray;
  outarray_local = (double *)valuename;
  valuename_local = (char *)instance;
  instance_local = (Instance *)p;
  while( true ) {
    bVar2 = false;
    if ((i._3_1_ & 1) != 0) {
      bVar2 = local_30 != *(int *)(valuename_local + 0x10) + 1U;
    }
    if (!bVar2) break;
    for (lexeme._4_4_ = 0; lexeme._4_4_ < 2; lexeme._4_4_ = lexeme._4_4_ + 1) {
      value = (double)get_token_lexeme((VrplibParser *)instance_local);
      if ((char *)value == (char *)0x0) {
        i._3_1_ = 0;
      }
      else if (lexeme._4_4_ == 0) {
        i._3_1_ = parse_node_id((VrplibParser *)instance_local,(char *)value,local_30);
      }
      else if (lexeme._4_4_ == 1) {
        local_48 = 0.0;
        _Var1 = str_to_double((char *)value,&local_48);
        if (_Var1) {
          _node_id[(int)local_30] = local_48;
        }
        else {
          parse_error((VrplibParser *)instance_local,"Expected valid double for %s",outarray_local);
          i._3_1_ = 0;
        }
      }
      if (value != 0.0) {
        free((void *)value);
      }
    }
    _Var1 = parser_match_newline((VrplibParser *)instance_local);
    if (!_Var1) {
      parse_error((VrplibParser *)instance_local,"Expected newline after parsing node id `%d`",
                  (ulong)local_30);
      i._3_1_ = 0;
    }
    local_30 = local_30 + 1;
  }
  return (_Bool)(i._3_1_ & 1);
}

Assistant:

static bool parse_node_double_tuple_section(VrplibParser *p, Instance *instance,
                                            char *valuename, double *outarray) {
    bool result = true;

    for (int32_t node_id = 0;
         result && (node_id != (instance->num_customers + 1)); node_id++) {
        for (int32_t i = 0; i < 2; i++) {
            char *lexeme = get_token_lexeme(p);
            if (!lexeme) {
                result = false;
            } else {
                switch (i) {
                case 0:
                    result = parse_node_id(p, lexeme, node_id);
                    break;
                case 1: {
                    // Parse the value
                    double value = 0;
                    if (!str_to_double(lexeme, &value)) {
                        parse_error(p, "Expected valid double for %s",
                                    valuename);
                        result = false;
                    } else {
                        outarray[node_id] = value;
                    }
                    break;
                }
                }
            }

            if (lexeme) {
                free(lexeme);
            }
        }

        if (!parser_match_newline(p)) {
            parse_error(p, "Expected newline after parsing node id `%d`",
                        node_id);
            result = false;
        }
    }

    return result;
}